

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O2

int __thiscall
WavingSketch<8U,_16U,_4U>::Bucket::Query
          (Bucket *this,Data<4U> *item,uint32_t seed_s,uint32_t seed_incast,bool only_heavy)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  undefined3 in_register_00000081;
  long lVar8;
  
  uVar4 = Data<4U>::Hash(item,seed_s);
  uVar5 = Data<4U>::Hash(item,seed_incast);
  uVar7 = 0;
  if (CONCAT31(in_register_00000081,only_heavy) == 0) {
    uVar7 = (int)this->incast[uVar5 & 0xf] * COUNT[uVar4 & 1];
    uVar7 = ~((int)uVar7 >> 0x1f) & uVar7;
  }
  lVar2 = 0;
  do {
    lVar8 = lVar2;
    if (lVar8 == 0x20) {
      return uVar7;
    }
    bVar3 = Data<4U>::operator==((Data<4U> *)(this->items[0].str + lVar8),item);
    lVar2 = lVar8 + 4;
  } while (!bVar3);
  iVar1 = *(int *)((long)this->counters + lVar8);
  iVar6 = -iVar1;
  if (0 < iVar1) {
    iVar6 = iVar1;
  }
  return iVar6;
}

Assistant:

int Query(const Data<DATA_LEN>& item, uint32_t seed_s, uint32_t seed_incast, bool only_heavy = false) {
			uint32_t choice = item.Hash(seed_s) & 1;
			uint32_t whichcast = item.Hash(seed_incast) % counter_num;
			count_type retv = (only_heavy == true) ? 0 : std::max(incast[whichcast] * COUNT[choice], 0);

			for (uint32_t i = 0; i < slot_num; ++i) {
				if (items[i] == item) {
					return std::abs(counters[i]);
				}
			}
			return retv;
		}